

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O2

bool rpn_IsDiffConstant(Expression *src,Symbol *sym)

{
  bool bVar1;
  Symbol *sym_00;
  Section *pSVar2;
  Section *pSVar3;
  
  sym_00 = rpn_SymbolOf(src);
  if (((sym == (Symbol *)0x0 || sym_00 == (Symbol *)0x0) || (sym_00->type != SYM_LABEL)) ||
     (sym->type != SYM_LABEL)) {
    bVar1 = false;
  }
  else {
    pSVar2 = sym_GetSection(sym_00);
    pSVar3 = sym_GetSection(sym);
    bVar1 = pSVar2 == pSVar3 && pSVar2 != (Section *)0x0;
  }
  return bVar1;
}

Assistant:

bool rpn_IsDiffConstant(struct Expression const *src, struct Symbol const *sym)
{
	// Check if both expressions only refer to a single symbol
	struct Symbol const *sym1 = rpn_SymbolOf(src);

	if (!sym1 || !sym || sym1->type != SYM_LABEL || sym->type != SYM_LABEL)
		return false;

	struct Section const *section1 = sym_GetSection(sym1);
	struct Section const *section2 = sym_GetSection(sym);
	return section1 && (section1 == section2);
}